

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImGuiDockNode * ImGui::DockContextAddNode(ImGuiContext *ctx,ImGuiID id)

{
  int *piVar1;
  ImGuiDockContext *this;
  void *pvVar2;
  ImGuiDockNode *this_00;
  
  if (id == 0) {
    this = ctx->DockContext;
    id = 0;
    do {
      id = id + 1;
      pvVar2 = ImGuiStorage::GetVoidPtr(&this->Nodes,id);
    } while (pvVar2 != (void *)0x0);
  }
  if (GImGui != (ImGuiContext *)0x0) {
    piVar1 = &(GImGui->IO).MetricsActiveAllocations;
    *piVar1 = *piVar1 + 1;
  }
  this_00 = (ImGuiDockNode *)(*GImAllocatorAllocFunc)(0xb8,GImAllocatorUserData);
  ImGuiDockNode::ImGuiDockNode(this_00,id);
  ImGuiStorage::SetVoidPtr(&ctx->DockContext->Nodes,this_00->ID,this_00);
  return this_00;
}

Assistant:

static ImGuiDockNode* ImGui::DockContextAddNode(ImGuiContext* ctx, ImGuiID id)
{
    // Generate an ID for the new node (the exact ID value doesn't matter as long as it is not already used) and add the first window.
    if (id == 0)
        id = DockContextGenNodeID(ctx);
    else
        IM_ASSERT(DockContextFindNodeByID(ctx, id) == NULL);

    // We don't set node->LastFrameAlive on construction. Nodes are always created at all time to reflect .ini settings!
    IMGUI_DEBUG_LOG_DOCKING("DockContextAddNode 0x%08X\n", id);
    ImGuiDockNode* node = IM_NEW(ImGuiDockNode)(id);
    ctx->DockContext->Nodes.SetVoidPtr(node->ID, node);
    return node;
}